

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderGlobals.cpp
# Opt level: O2

Pass * wasm::createReorderGlobalsAlwaysPass(void)

{
  Pass *pPVar1;
  
  pPVar1 = (Pass *)operator_new(0x60);
  pPVar1->runner = (PassRunner *)0x0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  (pPVar1->passArg).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pPVar1->_vptr_Pass = (_func_int **)&PTR__Pass_01124db8;
  *(undefined1 *)&pPVar1[1]._vptr_Pass = 1;
  return pPVar1;
}

Assistant:

Pass* createReorderGlobalsAlwaysPass() { return new ReorderGlobals(true); }